

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::eliminateNucleus(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *eps,
                  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *threshold)

{
  int *in_RDI;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000028;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_000000e0;
  int in_stack_000000e8;
  int in_stack_000000ec;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_000000f0;
  Pring *pivot;
  int c;
  int r;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_000005e0;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_000005e8;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  int iVar1;
  undefined4 in_stack_fffffffffffffe90;
  int iVar2;
  undefined4 in_stack_fffffffffffffe94;
  int iVar3;
  undefined1 local_148 [80];
  undefined1 local_f8 [24];
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffff20;
  undefined1 local_a8 [80];
  int *local_58;
  int local_50;
  int local_4c;
  undefined1 *local_28;
  undefined1 *local_18;
  reference local_10;
  undefined1 *local_8;
  
  if (*in_RDI != 2) {
    in_RDI[0xe4] = -1;
    in_RDI[0xe2] = -1;
    in_RDI[0xe3] = -1;
    do {
      if (in_RDI[1] + -1 <= in_RDI[0xdc]) {
        if (in_RDI[1] <= in_RDI[0xdc]) {
          return;
        }
        iVar3 = *(int *)(*(long *)(*(long *)(in_RDI + 0xec) + 0x20) + 0x10);
        iVar2 = *(int *)(*(long *)(*(long *)(in_RDI + 0xe8) + 0x20) + 0x10);
        *(undefined4 *)(*(long *)(in_RDI + 0xac) + (long)iVar3 * 4) = 0;
        *(int *)(*(long *)(in_RDI + 0xc4) + (long)iVar2 * 4) =
             *(int *)(*(long *)(in_RDI + 0xc4) + (long)iVar2 * 4) + -1;
        iVar1 = in_RDI[0xdc];
        local_50 = iVar2;
        local_4c = iVar3;
        local_10 = std::
                   vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 *)(in_RDI + 0xa2),
                                (long)*(int *)(*(long *)(in_RDI + 0xaa) + (long)iVar3 * 4));
        local_8 = local_148;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<100U,_int,_void> *)CONCAT44(iVar3,iVar2),
                   (cpp_dec_float<100U,_int,_void> *)CONCAT44(iVar1,in_stack_fffffffffffffe88));
        setPivot(this,eps._4_4_,(int)eps,threshold._4_4_,_c);
        return;
      }
      if (*(long *)(*(long *)(in_RDI + 0xec) + 0x20) == *(long *)(in_RDI + 0xec) + 0x20) {
        if (*(long *)(*(long *)(in_RDI + 0xe8) + 0x20) == *(long *)(in_RDI + 0xe8) + 0x20) {
          *(int **)(in_RDI + 0xde) = in_RDI + 0xde;
          *(int **)(in_RDI + 0xe0) = in_RDI + 0xde;
          local_28 = local_a8;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<100U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                     (cpp_dec_float<100U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
          selectPivots(in_stack_000005e8,in_stack_000005e0);
          for (local_58 = *(int **)(in_RDI + 0xde); local_58 != in_RDI + 0xde;
              local_58 = *(int **)local_58) {
            local_18 = local_f8;
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<100U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                       (cpp_dec_float<100U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
            eliminatePivot(in_stack_000000f0,in_stack_000000ec,in_stack_000000e8,in_stack_000000e0);
          }
        }
        else {
          eliminateColSingletons(in_stack_ffffffffffffff20);
        }
      }
      else {
        eliminateRowSingletons(in_stack_00000028);
      }
    } while ((**(long **)(in_RDI + 0xec) == *(long *)(in_RDI + 0xec)) &&
            (**(long **)(in_RDI + 0xe8) == *(long *)(in_RDI + 0xe8)));
    *in_RDI = 2;
  }
  return;
}

Assistant:

void CLUFactor<R>::eliminateNucleus(const R eps,
                                    const R threshold)
{
   int r, c;
   CLUFactor<R>::Pring* pivot;

   if(this->stat == SLinSolver<R>::SINGULAR)
      return;

   temp.pivots.mkwtz = -1;

   temp.pivots.idx = -1;

   temp.pivots.pos = -1;

   while(temp.stage < thedim - 1)
   {
#ifndef NDEBUG
      int i;
      // CLUFactorIsConsistent(fac);

      for(i = 0; i < thedim; ++i)
         if(col.perm[i] < 0)
            assert(temp.s_mark[i] == 0);

#endif

      if(temp.pivot_rowNZ[1].next != &(temp.pivot_rowNZ[1]))
         /* row singleton available */
         eliminateRowSingletons();
      else if(temp.pivot_colNZ[1].next != &(temp.pivot_colNZ[1]))
         /* column singleton available */
         eliminateColSingletons();
      else
      {
         initDR(temp.pivots);
         selectPivots(threshold);

         assert(temp.pivots.next != &temp.pivots &&
                "ERROR: no pivot element selected");

         for(pivot = temp.pivots.next; pivot != &temp.pivots;
               pivot = pivot->next)
         {
            eliminatePivot(pivot->idx, pivot->pos, eps);
         }
      }

      if(temp.pivot_rowNZ->next != temp.pivot_rowNZ ||
            temp.pivot_colNZ->next != temp.pivot_colNZ)
      {
         this->stat = SLinSolver<R>::SINGULAR;
         return;
      }
   }

   if(temp.stage < thedim)
   {
      /*      Eliminate remaining element.
       *      Note, that this must be both, column and row singleton.
       */
      assert(temp.pivot_rowNZ[1].next != &(temp.pivot_rowNZ[1]) &&
             "ERROR: one row must be left");
      assert(temp.pivot_colNZ[1].next != &(temp.pivot_colNZ[1]) &&
             "ERROR: one col must be left");
      r = temp.pivot_rowNZ[1].next->idx;
      c = temp.pivot_colNZ[1].next->idx;
      u.row.len[r] = 0;
      u.col.len[c]--;
      setPivot(temp.stage, c, r, u.row.val[u.row.start[r]]);
   }
}